

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::TranslucentMaterial::writeTo(TranslucentMaterial *this,BinaryWriter *binary)

{
  BinaryWriter *in_RDI;
  BinaryWriter *in_stack_ffffffffffffffa8;
  SP *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  Material::writeTo((Material *)in_RDI,in_stack_ffffffffffffffa8);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Texture,void>
            ((shared_ptr<pbrt::Entity> *)in_RDI,
             (shared_ptr<pbrt::Texture> *)in_stack_ffffffffffffffa8);
  BinaryWriter::serialize
            ((BinaryWriter *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
             in_stack_ffffffffffffffe0);
  BinaryWriter::write<int>(in_RDI,(int *)in_stack_ffffffffffffffa8);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x22845c);
  BinaryWriter::write<pbrt::math::vec3f>(in_RDI,(vec3f *)in_stack_ffffffffffffffa8);
  BinaryWriter::write<pbrt::math::vec3f>(in_RDI,(vec3f *)in_stack_ffffffffffffffa8);
  BinaryWriter::write<pbrt::math::vec3f>(in_RDI,(vec3f *)in_stack_ffffffffffffffa8);
  return 0x16;
}

Assistant:

int TranslucentMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(binary.serialize(map_kd));
    binary.write(reflect);
    binary.write(transmit);
    binary.write(kd);
    return TYPE_TRANSLUCENT_MATERIAL;
  }